

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::EnterIdleDecommit(HeapInfo *this)

{
  IdleDecommitPageAllocator::EnterIdleDecommit
            (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::EnterIdleDecommit
            (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::EnterIdleDecommit
            (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::EnterIdleDecommit(this->recyclerLeafPageAllocator);
  return;
}

Assistant:

void
HeapInfo::EnterIdleDecommit()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->EnterIdleDecommit();
    });
}